

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int start_page_no_capturepattern(vorb *f)

{
  uint8 uVar1;
  byte bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  uint8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((f->first_decode != '\0') && (f->push_mode == '\0')) {
    uVar3 = stb_vorbis_get_file_offset(f);
    (f->p_first).page_start = uVar3 - 4;
  }
  uVar1 = get8(f);
  if (uVar1 == '\0') {
    uVar1 = get8(f);
    f->page_flag = uVar1;
    uVar4 = get32(f);
    uVar5 = get32(f);
    get32(f);
    uVar6 = get32(f);
    f->last_page = uVar6;
    get32(f);
    bVar2 = get8(f);
    f->segment_count = (uint)bVar2;
    iVar7 = getn(f,f->segments,(uint)bVar2);
    if (iVar7 != 0) {
      f->end_seg_with_known_loc = -2;
      if ((uVar4 != 0xffffffff) || (uVar5 != 0xffffffff)) {
        uVar9 = (ulong)(uint)f->segment_count;
        puVar8 = f->segments + (uVar9 - 1);
        do {
          if ((int)uVar9 < 1) goto LAB_0013f507;
          uVar3 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar3;
          uVar1 = *puVar8;
          puVar8 = puVar8 + -1;
        } while (uVar1 == 0xff);
        f->end_seg_with_known_loc = uVar3;
        f->known_loc_for_packet = uVar4;
      }
LAB_0013f507:
      if (f->first_decode != '\0') {
        uVar3 = f->segment_count;
        uVar9 = 0;
        uVar10 = 0;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3;
        }
        iVar7 = 0;
        for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          iVar7 = iVar7 + (uint)f->segments[uVar9];
        }
        (f->p_first).page_end = (f->p_first).page_start + iVar7 + uVar3 + 0x1b;
        (f->p_first).last_decoded_sample = uVar4;
      }
      f->next_seg = 0;
      return 1;
    }
    f->error = VORBIS_unexpected_eof;
  }
  else {
    f->error = VORBIS_invalid_stream_structure_version;
  }
  return 0;
}

Assistant:

static int start_page_no_capturepattern(vorb *f)
{
   uint32 loc0,loc1,n;
   if (f->first_decode && !IS_PUSH_MODE(f)) {
      f->p_first.page_start = stb_vorbis_get_file_offset(f) - 4;
   }
   // stream structure version
   if (0 != get8(f)) return error(f, VORBIS_invalid_stream_structure_version);
   // header flag
   f->page_flag = get8(f);
   // absolute granule position
   loc0 = get32(f);
   loc1 = get32(f);
   // @TODO: validate loc0,loc1 as valid positions?
   // stream serial number -- vorbis doesn't interleave, so discard
   get32(f);
   //if (f->serial != get32(f)) return error(f, VORBIS_incorrect_stream_serial_number);
   // page sequence number
   n = get32(f);
   f->last_page = n;
   // CRC32
   get32(f);
   // page_segments
   f->segment_count = get8(f);
   if (!getn(f, f->segments, f->segment_count))
      return error(f, VORBIS_unexpected_eof);
   // assume we _don't_ know any the sample position of any segments
   f->end_seg_with_known_loc = -2;
   if (loc0 != ~0U || loc1 != ~0U) {
      int i;
      // determine which packet is the last one that will complete
      for (i=f->segment_count-1; i >= 0; --i)
         if (f->segments[i] < 255)
            break;
      // 'i' is now the index of the _last_ segment of a packet that ends
      if (i >= 0) {
         f->end_seg_with_known_loc = i;
         f->known_loc_for_packet   = loc0;
      }
   }
   if (f->first_decode) {
      int i,len;
      len = 0;
      for (i=0; i < f->segment_count; ++i)
         len += f->segments[i];
      len += 27 + f->segment_count;
      f->p_first.page_end = f->p_first.page_start + len;
      f->p_first.last_decoded_sample = loc0;
   }
   f->next_seg = 0;
   return TRUE;
}